

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int __thiscall cmsys::RegExpFind::regrepeat(RegExpFind *this,char *p)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  char *opnd;
  char *scan;
  int count;
  char *p_local;
  RegExpFind *this_local;
  
  scan._4_4_ = 0;
  opnd = this->reginput;
  __s = p + 3;
  switch(*p) {
  case '\x03':
    sVar1 = strlen(opnd);
    scan._4_4_ = (int)sVar1;
    opnd = opnd + scan._4_4_;
    break;
  case '\x04':
    while( true ) {
      bVar3 = false;
      if (*opnd != '\0') {
        pcVar2 = strchr(__s,(int)*opnd);
        bVar3 = pcVar2 != (char *)0x0;
      }
      if (!bVar3) break;
      scan._4_4_ = scan._4_4_ + 1;
      opnd = opnd + 1;
    }
    break;
  case '\x05':
    while( true ) {
      bVar3 = false;
      if (*opnd != '\0') {
        pcVar2 = strchr(__s,(int)*opnd);
        bVar3 = pcVar2 == (char *)0x0;
      }
      if (!bVar3) break;
      scan._4_4_ = scan._4_4_ + 1;
      opnd = opnd + 1;
    }
    break;
  default:
    printf("cm RegularExpression::find(): Internal error.\n");
    return 0;
  case '\b':
    for (; *__s == *opnd; opnd = opnd + 1) {
      scan._4_4_ = scan._4_4_ + 1;
    }
  }
  this->reginput = opnd;
  return scan._4_4_;
}

Assistant:

int RegExpFind::regrepeat(const char* p)
{
  int count = 0;
  const char* scan;
  const char* opnd;

  scan = reginput;
  opnd = OPERAND(p);
  switch (OP(p)) {
    case ANY:
      count = int(strlen(scan));
      scan += count;
      break;
    case EXACTLY:
      while (*opnd == *scan) {
        count++;
        scan++;
      }
      break;
    case ANYOF:
      while (*scan != '\0' && strchr(opnd, *scan) != KWSYS_NULLPTR) {
        count++;
        scan++;
      }
      break;
    case ANYBUT:
      while (*scan != '\0' && strchr(opnd, *scan) == KWSYS_NULLPTR) {
        count++;
        scan++;
      }
      break;
    default: // Oh dear.  Called inappropriately.
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("cm RegularExpression::find(): Internal error.\n");
      return 0;
  }
  reginput = scan;
  return (count);
}